

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O3

long __thiscall
text_subtitles::TextToPGSConverter::composeObjectDefinition
          (TextToPGSConverter *this,uint8_t *buff,int64_t pts,int64_t dts,int firstLine,int lastLine
          ,bool needPgHeader)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  uint8_t *__dest;
  int iVar5;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> seqPos;
  uint8_t *local_80;
  uchar **local_78;
  iterator iStack_70;
  uchar **local_68;
  uint local_60;
  int local_5c;
  uint8_t *local_58;
  uint8_t *local_50;
  int64_t local_48;
  int64_t local_40;
  uint8_t *local_38;
  
  local_78 = (uchar **)0x0;
  iStack_70._M_current = (uchar **)0x0;
  local_68 = (uchar **)0x0;
  local_38 = this->m_renderedData;
  local_60 = (lastLine - firstLine) + 1U & 0xffff;
  iVar5 = 0;
  iVar4 = 0;
  local_80 = buff;
  local_58 = buff;
  local_50 = buff;
  local_48 = pts;
  local_40 = dts;
  do {
    if (needPgHeader) {
      writePGHeader(local_80,local_48,local_40);
      local_80 = local_80 + 10;
    }
    puVar1 = local_80 + 1;
    *local_80 = '\x15';
    local_80[3] = '\0';
    puVar2 = local_80 + 5;
    local_80[4] = '\0';
    local_80 = local_80 + 6;
    *puVar2 = '\0';
    if (iStack_70._M_current == local_68) {
      std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
      _M_realloc_insert<unsigned_char*const&>
                ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)&local_78,iStack_70,
                 &local_80);
    }
    else {
      *iStack_70._M_current = local_80;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
    puVar2 = local_80 + 1;
    *local_80 = '\0';
    iVar3 = 0xffeb;
    local_5c = iVar4 + -1;
    __dest = puVar2;
    if (iVar4 == 0) {
      local_80 = local_80 + 4;
      AV_WB16(local_80,this->m_videoWidth);
      local_80 = local_80 + 2;
      AV_WB16(local_80,(uint16_t)local_60);
      iVar3 = 0xffe4;
      __dest = local_80 + 2;
      local_58 = puVar2;
    }
    iVar4 = this->m_rleLen - iVar5;
    if (iVar3 <= iVar4) {
      iVar4 = iVar3;
    }
    local_80 = __dest;
    memcpy(__dest,local_38 + iVar5,(long)iVar4);
    local_80 = local_80 + iVar4;
    AV_WB16(puVar1,(short)local_80 - ((short)puVar1 + 2));
    iVar5 = iVar5 + iVar4;
    iVar4 = local_5c;
  } while (iVar5 < this->m_rleLen);
  AV_WB24(local_58,this->m_rleLen + 4);
  puVar1 = local_80;
  if (local_78 != iStack_70._M_current) {
    **local_78 = **local_78 | 0x80;
    *iStack_70._M_current[-1] = *iStack_70._M_current[-1] | 0x40;
  }
  if (local_78 != (uchar **)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return (long)puVar1 - (long)local_50;
}

Assistant:

long TextToPGSConverter::composeObjectDefinition(uint8_t* buff, const int64_t pts, const int64_t dts,
                                                 const int firstLine, const int lastLine, const bool needPgHeader) const
{
    std::vector<uint8_t*> seqPos;

    const uint8_t* srcData = m_renderedData;
    int srcProcessed = 0;
    int blocks = 0;
    uint8_t* curPos = buff;
    uint8_t* sizePos = buff;
    do
    {
        if (needPgHeader)
            curPos += writePGHeader(curPos, pts, dts);
        *curPos++ = OBJECT_DEF_SEGMENT;
        curPos += 2;  // skip length field
        uint8_t* fragmentStart = curPos;
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // object version number
        seqPos.push_back(curPos);
        *curPos++ = 0;  // 0xc0; // sequence descriptor: first=true, last=true

        if (blocks == 0)
        {
            sizePos = curPos;
            // object data header
            curPos += 3;  // skip total size
            AV_WB16(curPos, m_videoWidth);
            curPos += 2;
            AV_WB16(curPos, static_cast<uint16_t>(lastLine - firstLine + 1));
            curPos += 2;
        }

        int MAX_PG_PACKET = 65515;
        if (blocks == 0)
            MAX_PG_PACKET -= 7;
        const int size = FFMIN(m_rleLen - srcProcessed, MAX_PG_PACKET);
        memcpy(curPos, srcData + srcProcessed, size);
        srcProcessed += size;
        curPos += size;

        AV_WB16(fragmentStart - 2, static_cast<uint16_t>(curPos - fragmentStart));  // correct length field
        blocks++;
    } while (srcProcessed < m_rleLen);
    AV_WB24(sizePos, m_rleLen + 4);  // object len
    if (!seqPos.empty())
    {
        *(seqPos[0]) |= 0x80;
        *(seqPos[seqPos.size() - 1]) |= 0x40;
    }
    return static_cast<long>(curPos - buff);
}